

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O3

double __thiscall
EncoderVelocity::GetEncoderVelocityPredicted(EncoderVelocity *this,double percent_threshold)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_30;
  double local_28;
  
  uVar1 = this->velPeriod;
  if (this->velOverflow == true) {
    local_30 = this->clkPeriod;
  }
  else {
    local_30 = this->clkPeriod;
    if (this->dirChange == false) {
      local_28 = 4.0 / ((double)(uVar1 + (uVar1 == 0)) * local_30);
      if (this->velDir == false) {
        local_28 = (double)((ulong)local_28 ^ (ulong)DAT_00122710);
      }
      goto LAB_001144d5;
    }
  }
  local_28 = 0.0;
LAB_001144d5:
  dVar3 = GetEncoderAcceleration(this,percent_threshold);
  dVar2 = (double)this->runPeriod * local_30;
  dVar3 = ((double)uVar1 * local_30 * 0.5 + dVar2) * dVar3 + local_28;
  dVar4 = 0.0;
  if (0.0 <= local_28) {
    if (0.0 < local_28) {
      if (0.0 <= dVar3) {
        dVar4 = dVar3;
      }
      if (1.0 < dVar2 * dVar4) {
        dVar4 = 1.0 / dVar2;
      }
    }
  }
  else {
    if (dVar3 <= 0.0) {
      dVar4 = dVar3;
    }
    if (dVar2 * dVar4 < -1.0) {
      dVar4 = -1.0 / dVar2;
    }
  }
  return dVar4;
}

Assistant:

double EncoderVelocity::GetEncoderVelocityPredicted(double percent_threshold) const
{
    double encVel = GetEncoderVelocity();
    double encAcc = GetEncoderAcceleration(percent_threshold);
    // The encoder measurement delay is half the measured period, based on the assumption that measuring the
    // period over a full cycle (4 quadrature counts) estimates the velocity in the middle of that cycle.
    double encDelay = velPeriod*clkPeriod/2.0;
    double encRun = GetEncoderRunningCounterSeconds();
    double deltaVel = encAcc*(encDelay+encRun);
    double predVel = encVel+deltaVel;
    if (encVel < 0) {
        // Do not change velocity direction
        if (predVel > 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun < -1.0)
            predVel = -1.0/encRun;
    }
    else if (encVel > 0.0) {
        // Do not change velocity direction
        if (predVel < 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun > 1.0)
            predVel = 1.0/encRun;
    }
    else {
        // If not moving, do not attempt to predict
        predVel = 0.0;
    }
    return predVel;
}